

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswMan.c
# Opt level: O0

int Ssw_ManCountEquivs(Ssw_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  int local_20;
  int local_1c;
  int nEquivs;
  int i;
  Aig_Obj_t *pObj;
  Ssw_Man_t *p_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->pAig->vObjs), local_1c < iVar1; local_1c = local_1c + 1)
  {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,local_1c);
    if (pAVar2 != (Aig_Obj_t *)0x0) {
      pAVar2 = Aig_ObjRepr(p->pAig,pAVar2);
      local_20 = (uint)(pAVar2 != (Aig_Obj_t *)0x0) + local_20;
    }
  }
  return local_20;
}

Assistant:

int Ssw_ManCountEquivs( Ssw_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, nEquivs = 0;
    Aig_ManForEachObj( p->pAig, pObj, i )
        nEquivs += ( Aig_ObjRepr(p->pAig, pObj) != NULL );
    return nEquivs;
}